

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O0

int __thiscall
Analysis::LexicalAnalysis::ReadFile(LexicalAnalysis *this,vector<char,_std::allocator<char>_> *Code)

{
  bool bVar1;
  istream *piVar2;
  undefined1 local_38 [8];
  string line;
  vector<char,_std::allocator<char>_> *Code_local;
  LexicalAnalysis *this_local;
  
  line.field_2._8_8_ = Code;
  std::__cxx11::string::string((string *)local_38);
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)this,(string *)local_38);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1) break;
    TokenizeLine(this,(string *)local_38,(vector<char,_std::allocator<char>_> *)line.field_2._8_8_);
  }
  std::__cxx11::string::~string((string *)local_38);
  return 0;
}

Assistant:

int LexicalAnalysis::ReadFile(std::vector<char> &Code) {

        std::string line;

        //read the file line by line
        while (std::getline(file, line)) {
            TokenizeLine(line, Code);
        }
        return 0;
    }